

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O3

void nghttp2_bufs_free(nghttp2_bufs *bufs)

{
  nghttp2_buf_chain *pnVar1;
  nghttp2_mem *mem;
  nghttp2_buf_chain *ptr;
  
  if (bufs != (nghttp2_bufs *)0x0) {
    ptr = bufs->head;
    while (ptr != (nghttp2_buf_chain *)0x0) {
      pnVar1 = ptr->next;
      mem = bufs->mem;
      nghttp2_mem_free(mem,(ptr->buf).begin);
      (ptr->buf).begin = (uint8_t *)0x0;
      nghttp2_mem_free(mem,ptr);
      ptr = pnVar1;
    }
    bufs->head = (nghttp2_buf_chain *)0x0;
  }
  return;
}

Assistant:

void nghttp2_bufs_free(nghttp2_bufs *bufs) {
  nghttp2_buf_chain *chain, *next_chain;

  if (bufs == NULL) {
    return;
  }

  for (chain = bufs->head; chain;) {
    next_chain = chain->next;

    buf_chain_del(chain, bufs->mem);

    chain = next_chain;
  }

  bufs->head = NULL;
}